

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::FormattingScene::TransformBegin(FormattingScene *this,FileLoc loc)

{
  undefined1 *puVar1;
  string local_30;
  
  indent_abi_cxx11_(&local_30,this,0);
  Printf<std::__cxx11::string>("%sTransformBegin\n",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  puVar1 = &(this->super_SceneRepresentation).field_0xc;
  *(int *)puVar1 = *(int *)puVar1 + 4;
  return;
}

Assistant:

void FormattingScene::TransformBegin(FileLoc loc) {
    Printf("%sTransformBegin\n", indent());
    catIndentCount += 4;
}